

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint in_ESI;
  long in_RDI;
  PgHdr1 *pPage;
  PgHdr1 **pp;
  uint h;
  PgHdr1 *pPage_00;
  PgHdr1 **local_18;
  uint local_10;
  
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x2c); local_10 = local_10 + 1) {
    local_18 = (PgHdr1 **)(*(long *)(in_RDI + 0x30) + (ulong)local_10 * 8);
    while (pPage_00 = *local_18, pPage_00 != (PgHdr1 *)0x0) {
      if (pPage_00->iKey < in_ESI) {
        local_18 = &pPage_00->pNext;
      }
      else {
        *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + -1;
        *local_18 = pPage_00->pNext;
        if (pPage_00->isPinned == '\0') {
          pcache1PinPage(pPage_00);
        }
        pcache1FreePage(pPage_00);
      }
    }
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( unsigned int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  for(h=0; h<pCache->nHash; h++){
    PgHdr1 **pp = &pCache->apHash[h]; 
    PgHdr1 *pPage;
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( !pPage->isPinned ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( nPage++; )
      }
    }
  }
  assert( pCache->nPage==nPage );
}